

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O3

void __thiscall
CGL::SceneObjects::Triangle::Triangle(Triangle *this,Mesh *mesh,size_t v1,size_t v2,size_t v3)

{
  double *pdVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  BSDF *pBVar7;
  anon_union_32_3_e2189aaa_for_Vector3D_0 local_58;
  anon_union_32_3_e2189aaa_for_Vector3D_0 local_38;
  
  (this->super_Primitive)._vptr_Primitive = (_func_int **)&PTR_get_bbox_00119948;
  (this->p1).field_0.field_0.x = 0.0;
  (this->p1).field_0.field_0.y = 0.0;
  (this->p1).field_0.field_0.z = 0.0;
  (this->p2).field_0.field_0.x = 0.0;
  (this->p2).field_0.field_0.y = 0.0;
  (this->p2).field_0.field_0.z = 0.0;
  (this->p3).field_0.field_0.x = 0.0;
  (this->p3).field_0.field_0.y = 0.0;
  (this->p3).field_0.field_0.z = 0.0;
  (this->n1).field_0.field_0.x = 0.0;
  (this->n1).field_0.field_0.y = 0.0;
  (this->n1).field_0.field_0.z = 0.0;
  (this->n2).field_0.field_0.x = 0.0;
  (this->n2).field_0.field_0.y = 0.0;
  (this->n2).field_0.field_0.z = 0.0;
  (this->n3).field_0.field_0.x = 0.0;
  (this->n3).field_0.field_0.y = 0.0;
  (this->n3).field_0.field_0.z = 0.0;
  (this->bbox).max.field_0.field_0.x = -INFINITY;
  (this->bbox).max.field_0.field_0.y = -INFINITY;
  (this->bbox).max.field_0.field_0.z = -INFINITY;
  (this->bbox).min.field_0.field_0.x = INFINITY;
  (this->bbox).min.field_0.field_0.y = INFINITY;
  (this->bbox).min.field_0.field_0.z = INFINITY;
  (this->bbox).extent.field_0.field_0.x = -INFINITY;
  (this->bbox).extent.field_0.field_0.y = -INFINITY;
  (this->bbox).extent.field_0.field_0.z = -INFINITY;
  pdVar1 = (double *)(*(long *)(mesh + 8) + v1 * 0x20);
  dVar2 = pdVar1[1];
  dVar5 = pdVar1[2];
  dVar6 = pdVar1[3];
  (this->p1).field_0.field_0.x = *pdVar1;
  (this->p1).field_0.field_0.y = dVar2;
  (this->p1).field_0.field_0.z = dVar5;
  *(double *)((long)&(this->p1).field_0 + 0x18) = dVar6;
  pdVar1 = (double *)(*(long *)(mesh + 8) + v2 * 0x20);
  dVar2 = pdVar1[1];
  dVar5 = pdVar1[2];
  dVar6 = pdVar1[3];
  (this->p2).field_0.field_0.x = *pdVar1;
  (this->p2).field_0.field_0.y = dVar2;
  (this->p2).field_0.field_0.z = dVar5;
  *(double *)((long)&(this->p2).field_0 + 0x18) = dVar6;
  pdVar1 = (double *)(*(long *)(mesh + 8) + v3 * 0x20);
  dVar2 = pdVar1[1];
  dVar5 = pdVar1[2];
  dVar6 = pdVar1[3];
  (this->p3).field_0.field_0.x = *pdVar1;
  (this->p3).field_0.field_0.y = dVar2;
  (this->p3).field_0.field_0.z = dVar5;
  *(double *)((long)&(this->p3).field_0 + 0x18) = dVar6;
  pdVar1 = (double *)(*(long *)(mesh + 0x10) + v1 * 0x20);
  dVar2 = pdVar1[1];
  dVar5 = pdVar1[2];
  dVar6 = pdVar1[3];
  (this->n1).field_0.field_0.x = *pdVar1;
  (this->n1).field_0.field_0.y = dVar2;
  (this->n1).field_0.field_0.z = dVar5;
  *(double *)((long)&(this->n1).field_0 + 0x18) = dVar6;
  pdVar1 = (double *)(*(long *)(mesh + 0x10) + v2 * 0x20);
  dVar2 = pdVar1[1];
  dVar5 = pdVar1[2];
  dVar6 = pdVar1[3];
  (this->n2).field_0.field_0.x = *pdVar1;
  (this->n2).field_0.field_0.y = dVar2;
  (this->n2).field_0.field_0.z = dVar5;
  *(double *)((long)&(this->n2).field_0 + 0x18) = dVar6;
  pdVar1 = (double *)(*(long *)(mesh + 0x10) + v3 * 0x20);
  dVar2 = pdVar1[1];
  dVar5 = pdVar1[2];
  dVar6 = pdVar1[3];
  (this->n3).field_0.field_0.x = *pdVar1;
  (this->n3).field_0.field_0.y = dVar2;
  (this->n3).field_0.field_0.z = dVar5;
  *(double *)((long)&(this->n3).field_0 + 0x18) = dVar6;
  auVar3 = *(undefined1 (*) [16])(this->p1).field_0.field_2.__vec;
  dVar2 = (this->p1).field_0.field_0.z;
  auVar4 = vsubpd_avx(auVar3,auVar3);
  *(undefined1 (*) [16])(this->bbox).max.field_0.field_2.__vec = auVar3;
  (this->bbox).max.field_0.field_0.z = dVar2;
  *(undefined1 (*) [16])(this->bbox).min.field_0.field_2.__vec = auVar3;
  (this->bbox).min.field_0.field_0.z = dVar2;
  *(undefined1 (*) [16])(this->bbox).extent.field_0.field_2.__vec = auVar4;
  (this->bbox).extent.field_0.field_0.z = dVar2 - dVar2;
  local_38.field_0.x = (this->p2).field_0.field_0.x;
  local_38.field_0.y = (this->p2).field_0.field_0.y;
  local_38.field_0.z = (this->p2).field_0.field_0.z;
  BBox::expand(&this->bbox,(Vector3D *)&local_38.field_0);
  local_58.field_0.x = (this->p3).field_0.field_0.x;
  local_58.field_0.y = (this->p3).field_0.field_0.y;
  local_58.field_0.z = (this->p3).field_0.field_0.z;
  BBox::expand(&this->bbox,(Vector3D *)&local_58.field_0);
  pBVar7 = (BSDF *)(**(code **)(*(long *)mesh + 8))(mesh);
  this->bsdf = pBVar7;
  return;
}

Assistant:

Triangle::Triangle(const Mesh *mesh, size_t v1, size_t v2, size_t v3) {
  p1 = mesh->positions[v1];
  p2 = mesh->positions[v2];
  p3 = mesh->positions[v3];
  n1 = mesh->normals[v1];
  n2 = mesh->normals[v2];
  n3 = mesh->normals[v3];
  bbox = BBox(p1);
  bbox.expand(p2);
  bbox.expand(p3);

  bsdf = mesh->get_bsdf();
}